

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcConversionBasedUnit_00996d00;
  *(undefined ***)&this->field_0x70 = &PTR__IfcConversionBasedUnit_00996d50;
  *(undefined ***)&(this->super_IfcNamedUnit).field_0x38 = &PTR__IfcConversionBasedUnit_00996d28;
  puVar1 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48;
  if (puVar1 != &this->field_0x58) {
    operator_delete(puVar1);
  }
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x996d78;
  *(undefined8 *)&this->field_0x70 = 0x996da0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
  if (puVar1 != &(this->super_IfcNamedUnit).field_0x28) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}